

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::VariableNameLengthValidator::validateNameLength
          (VariableNameLengthValidator *this,string *implementationName,GLint propValue)

{
  ostringstream *poVar1;
  size_type sVar2;
  int iVar3;
  allocator<char> local_1a9;
  undefined1 local_1a8 [384];
  
  sVar2 = implementationName->_M_string_length;
  local_1a8._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying name length, expecting ");
  iVar3 = (int)sVar2 + 1;
  std::ostream::operator<<(poVar1,iVar3);
  std::operator<<((ostream *)poVar1," (");
  std::ostream::operator<<(poVar1,(int)implementationName->_M_string_length);
  std::operator<<((ostream *)poVar1," for \"");
  std::operator<<((ostream *)poVar1,(string *)implementationName);
  std::operator<<((ostream *)poVar1,"\" + 1 byte for terminating null character)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (iVar3 != propValue) {
    local_1a8._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tError, invalid name length, got ");
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"name length invalid",&local_1a9);
    PropValidator::setError((PropValidator *)this,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  return;
}

Assistant:

void VariableNameLengthValidator::validateNameLength (const std::string& implementationName, glw::GLint propValue) const
{
	const int expected = (int)implementationName.length() + 1; // includes null byte
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying name length, expecting " << expected << " (" << (int)implementationName.length() << " for \"" << implementationName << "\" + 1 byte for terminating null character)" << tcu::TestLog::EndMessage;

	if (propValue != expected)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid name length, got " << propValue << tcu::TestLog::EndMessage;
		setError("name length invalid");
	}
}